

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O2

ggml_status ggml_graph_compute(ggml_cgraph *cgraph,ggml_cplan *cplan)

{
  ggml_status gVar1;
  pthread_mutex_t *ppVar2;
  FILE *__stream;
  _Bool _Var3;
  int iVar4;
  pthread_mutex_t *__mutex;
  cpu_set_t *__cpuset;
  ulong uVar5;
  pthread_t __th;
  char *pcVar6;
  undefined8 uVar7;
  uint i;
  ulong uVar8;
  _Bool *mask;
  ulong __n;
  ggml_threadpool_params ttp;
  
  ggml_cpu_init();
  if (cplan == (ggml_cplan *)0x0) {
    pcVar6 = "cplan";
    uVar7 = 0xc16;
  }
  else {
    iVar4 = cplan->n_threads;
    if (iVar4 < 1) {
      pcVar6 = "cplan->n_threads > 0";
      uVar7 = 0xc17;
    }
    else {
      if ((cplan->work_size == 0) || (cplan->work_data != (uint8_t *)0x0)) {
        ppVar2 = (pthread_mutex_t *)cplan->threadpool;
        if (ppVar2 == (pthread_mutex_t *)0x0) {
          ggml_threadpool_params_default(&ttp,iVar4);
          __mutex = (pthread_mutex_t *)ggml_threadpool_new_impl(&ttp,cgraph,cplan);
        }
        else {
          *(ggml_cgraph **)((long)ppVar2 + 0x58) = cgraph;
          *(ggml_cplan **)((long)ppVar2 + 0x60) = cplan;
          LOCK();
          *(undefined4 *)((long)ppVar2 + 0x100) = 0;
          UNLOCK();
          LOCK();
          *(undefined4 *)((long)ppVar2 + 0x108) = 0xffffffff;
          UNLOCK();
          *(undefined4 *)((long)ppVar2 + 0x128) = 0;
          __mutex = ppVar2;
        }
        if (__mutex[7].__data.__lock < iVar4) {
          ggml_log_internal(3,"cplan requested more threads (%d) than available (%d)\n",iVar4);
          iVar4 = __mutex[7].__data.__lock;
        }
        pthread_mutex_lock(__mutex);
        *(int *)((long)__mutex + 0x11c) = iVar4;
        LOCK();
        *(int *)((long)__mutex + 0x68) = *(int *)((long)__mutex + 0x68) + 1;
        UNLOCK();
        if ((*(byte *)((long)__mutex + 0x105) & 1) == 0) {
          pthread_cond_broadcast((pthread_cond_t *)(__mutex + 1));
        }
        else {
          ggml_thread_apply_priority(*(int32_t *)((long)__mutex + 0x120));
          mask = (_Bool *)(*(long *)((long)__mutex + 0x110) + 8);
          _Var3 = ggml_thread_cpumask_is_valid(mask);
          if (_Var3) {
            ggml_thread_apply_affinity(mask);
          }
          ggml_threadpool_resume_locked((ggml_threadpool *)&__mutex->__data);
        }
        pthread_mutex_unlock(__mutex);
        ggml_graph_compute_thread(*(void **)((long)__mutex + 0x110));
        if (1 < g_state.numa.n_nodes) {
          __n = (ulong)((uint)((ulong)g_state.numa.total_cpus + 0x3f >> 3) & 0xfffffff8);
          __cpuset = __sched_cpualloc((ulong)g_state.numa.total_cpus);
          memset(__cpuset,0,__n);
          uVar5 = (ulong)g_state.numa.total_cpus;
          for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
            if (uVar8 >> 3 < __n) {
              __cpuset->__bits[uVar8 >> 6] = __cpuset->__bits[uVar8 >> 6] | 1L << (uVar8 & 0x3f);
            }
          }
          __th = pthread_self();
          iVar4 = pthread_setaffinity_np(__th,__n,__cpuset);
          __stream = _stderr;
          if (iVar4 != 0) {
            pcVar6 = strerror(iVar4);
            fprintf(__stream,"warning: pthread_setaffinity_np() failed: %s\n",pcVar6);
          }
          __sched_cpufree(__cpuset);
        }
        gVar1 = *(ggml_status *)((long)__mutex + 0x128);
        if (ppVar2 == (pthread_mutex_t *)0x0) {
          ggml_threadpool_free((ggml_threadpool *)&__mutex->__data);
        }
        return gVar1;
      }
      pcVar6 = "cplan->work_size == 0 || cplan->work_data != NULL";
      uVar7 = 0xc18;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
             ,uVar7,"GGML_ASSERT(%s) failed",pcVar6);
}

Assistant:

enum ggml_status ggml_graph_compute(struct ggml_cgraph * cgraph, struct ggml_cplan * cplan) {
    ggml_cpu_init();

    GGML_ASSERT(cplan);
    GGML_ASSERT(cplan->n_threads > 0);
    GGML_ASSERT(cplan->work_size == 0 || cplan->work_data != NULL);

    int n_threads                               = cplan->n_threads;
    struct ggml_threadpool * threadpool = cplan->threadpool;

    bool disposable_threadpool = false;

    if (threadpool == NULL) {
        //GGML_PRINT_DEBUG("Threadpool is not specified. Will create a disposable threadpool : n_threads %d\n", n_threads);
        disposable_threadpool = true;

        struct ggml_threadpool_params ttp = ggml_threadpool_params_default(n_threads);
        threadpool = ggml_threadpool_new_impl(&ttp, cgraph, cplan);
    } else {
        // Reset some of the parameters that need resetting
        // No worker threads should be accessing the parameters below at this stage
        threadpool->cgraph           = cgraph;
        threadpool->cplan            = cplan;
        threadpool->current_chunk    = 0;
        threadpool->abort            = -1;
        threadpool->ec               = GGML_STATUS_SUCCESS;
    }

#ifdef GGML_USE_OPENMP
    if (n_threads > 1) {
        #pragma omp parallel num_threads(n_threads)
        {
            #pragma omp single
            {
                // update the number of threads from the actual number of threads that we got from OpenMP
                n_threads = omp_get_num_threads();
                atomic_store_explicit(&threadpool->n_threads_cur, n_threads, memory_order_relaxed);
            }

            ggml_graph_compute_thread(&threadpool->workers[omp_get_thread_num()]);
        }
    } else {
        atomic_store_explicit(&threadpool->n_threads_cur, 1, memory_order_relaxed);
        ggml_graph_compute_thread(&threadpool->workers[0]);
    }
#else
    if (n_threads > threadpool->n_threads_max) {
        GGML_LOG_WARN("cplan requested more threads (%d) than available (%d)\n", n_threads, threadpool->n_threads_max);
        n_threads = threadpool->n_threads_max;
    }

    // Kick all threads to start the new graph
    ggml_graph_compute_kickoff(threadpool, n_threads);

    // This is a work thread too
    ggml_graph_compute_thread(&threadpool->workers[0]);
#endif

    // don't leave affinity set on the main thread
    clear_numa_thread_affinity();

    enum ggml_status ret = threadpool->ec;

    if (disposable_threadpool) {
        ggml_threadpool_free(threadpool);
    }

    return ret;
}